

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

bool __thiscall cfd::core::DescriptorNode::ExistUncompressedKey(DescriptorNode *this)

{
  DescriptorNode *pDVar1;
  bool bVar2;
  DescriptorNode *this_00;
  bool bVar3;
  
  bVar3 = true;
  if (this->is_uncompressed_key_ == false) {
    this_00 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = this_00 != pDVar1;
    if (bVar3) {
      bVar2 = ExistUncompressedKey(this_00);
      while (!bVar2) {
        this_00 = this_00 + 1;
        bVar3 = this_00 != pDVar1;
        if (this_00 == pDVar1) {
          return bVar3;
        }
        bVar2 = ExistUncompressedKey(this_00);
      }
    }
  }
  return bVar3;
}

Assistant:

bool DescriptorNode::ExistUncompressedKey() {
  if (is_uncompressed_key_) return true;
  for (auto& child : child_node_) {
    if (child.ExistUncompressedKey()) return true;
  }
  return false;
}